

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode AcceptServerConnect(connectdata *conn)

{
  SessionHandle *data_00;
  int iVar1;
  socklen_t local_3c;
  int error;
  curl_socklen_t size;
  sockaddr_in add;
  curl_socket_t s;
  curl_socket_t sock;
  SessionHandle *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  add.sin_zero._4_4_ = conn->sock[1];
  add.sin_zero[0] = 0xff;
  add.sin_zero[1] = 0xff;
  add.sin_zero[2] = 0xff;
  add.sin_zero[3] = 0xff;
  local_3c = 0x10;
  iVar1 = getsockname(add.sin_zero._4_4_,(sockaddr *)&error,&local_3c);
  if (iVar1 == 0) {
    local_3c = 0x10;
    add.sin_zero._0_4_ = accept(add.sin_zero._4_4_,(sockaddr *)&error,&local_3c);
  }
  Curl_closesocket(conn,add.sin_zero._4_4_);
  if (add.sin_zero._0_4_ == -1) {
    Curl_failf(data_00,"Error accept()ing server connect");
    conn_local._4_4_ = CURLE_FTP_PORT_FAILED;
  }
  else {
    Curl_infof(data_00,"Connection accepted from server\n");
    conn->sock[1] = add.sin_zero._0_4_;
    curlx_nonblock(add.sin_zero._0_4_,1);
    conn->sock_accepted[1] = true;
    if (((data_00->set).fsockopt == (curl_sockopt_callback)0x0) ||
       (iVar1 = (*(data_00->set).fsockopt)
                          ((data_00->set).sockopt_client,add.sin_zero._0_4_,CURLSOCKTYPE_ACCEPT),
       iVar1 == 0)) {
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_closesocket(conn,add.sin_zero._0_4_);
      conn->sock[1] = -1;
      conn_local._4_4_ = CURLE_ABORTED_BY_CALLBACK;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode AcceptServerConnect(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  curl_socket_t sock = conn->sock[SECONDARYSOCKET];
  curl_socket_t s = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
  struct Curl_sockaddr_storage add;
#else
  struct sockaddr_in add;
#endif
  curl_socklen_t size = (curl_socklen_t) sizeof(add);

  if(0 == getsockname(sock, (struct sockaddr *) &add, &size)) {
    size = sizeof(add);

    s=accept(sock, (struct sockaddr *) &add, &size);
  }
  Curl_closesocket(conn, sock); /* close the first socket */

  if(CURL_SOCKET_BAD == s) {
    failf(data, "Error accept()ing server connect");
    return CURLE_FTP_PORT_FAILED;
  }
  infof(data, "Connection accepted from server\n");

  conn->sock[SECONDARYSOCKET] = s;
  curlx_nonblock(s, TRUE); /* enable non-blocking */
  conn->sock_accepted[SECONDARYSOCKET] = TRUE;

  if(data->set.fsockopt) {
    int error = 0;

    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               s,
                               CURLSOCKTYPE_ACCEPT);

    if(error) {
      Curl_closesocket(conn, s); /* close the socket and bail out */
      conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD;
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  return CURLE_OK;

}